

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.hpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::BindInfo::Invalidate(BindInfo *this)

{
  BindInfo local_138;
  BindInfo *local_10;
  BindInfo *this_local;
  
  local_10 = this;
  BindInfo(&local_138);
  operator=(this,&local_138);
  ~BindInfo(&local_138);
  return;
}

Assistant:

void Invalidate()
        {
            *this = {};
        }